

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O2

void perlinInit(PerlinNoise *noise,uint64_t *seed)

{
  uint8_t uVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint64_t uVar6;
  ulong uVar7;
  double dVar8;
  
  dVar8 = nextDouble(seed);
  noise->a = dVar8 * 256.0;
  dVar8 = nextDouble(seed);
  noise->b = dVar8 * 256.0;
  dVar8 = nextDouble(seed);
  noise->c = dVar8 * 256.0;
  noise->amplitude = 1.0;
  noise->lacunarity = 1.0;
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    noise->d[lVar4] = (uint8_t)lVar4;
  }
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    uVar7 = 0x100 - lVar4;
    uVar6 = *seed;
    if (((uint)uVar7 & (uint)uVar7 - 1) == 0) {
      uVar5 = uVar6 * 0x5deece66d + 0xb & 0xffffffffffff;
      *seed = uVar5;
      iVar3 = (int)((uVar5 >> 0x11) * uVar7 >> 0x1f);
    }
    else {
      do {
        uVar6 = uVar6 * 0x5deece66d + 0xb & 0xffffffffffff;
        iVar3 = (int)((uVar6 >> 0x11) % (uVar7 & 0xffffffff));
      } while (-1 < (int)((iVar3 + ((uint)lVar4 | 0xffffff00)) - (int)(uVar6 >> 0x11)));
      *seed = uVar6;
    }
    iVar3 = (uint)lVar4 + iVar3;
    uVar1 = noise->d[lVar4];
    noise->d[lVar4] = noise->d[iVar3];
    noise->d[iVar3] = uVar1;
  }
  noise->d[0x100] = noise->d[0];
  dVar8 = noise->b;
  dVar2 = floor(dVar8);
  dVar8 = dVar8 - dVar2;
  noise->h2 = (uint8_t)(int)dVar2;
  noise->d2 = dVar8;
  noise->t2 = ((dVar8 * 6.0 + -15.0) * dVar8 + 10.0) * dVar8 * dVar8 * dVar8;
  return;
}

Assistant:

void perlinInit(PerlinNoise *noise, uint64_t *seed)
{
    int i = 0;
    //memset(noise, 0, sizeof(*noise));
    noise->a = nextDouble(seed) * 256.0;
    noise->b = nextDouble(seed) * 256.0;
    noise->c = nextDouble(seed) * 256.0;
    noise->amplitude = 1.0;
    noise->lacunarity = 1.0;

    uint8_t *idx = noise->d;
    for (i = 0; i < 256; i++)
    {
        idx[i] = i;
    }
    for (i = 0; i < 256; i++)
    {
        int j = nextInt(seed, 256 - i) + i;
        uint8_t n = idx[i];
        idx[i] = idx[j];
        idx[j] = n;
    }
    idx[256] = idx[0];
    double i2 = floor(noise->b);
    double d2 = noise->b - i2;
    noise->h2 = (int) i2;
    noise->d2 = d2;
    noise->t2 = d2*d2*d2 * (d2 * (d2*6.0-15.0) + 10.0);
}